

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O3

floatx80 float128_to_floatx80_x86_64(float128 a,float_status *status)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  uint uVar4;
  bool bVar5;
  floatx80 fVar6;
  int32_t aExp;
  uint local_3c;
  ulong local_38;
  ulong local_30;
  
  uVar1 = a.high;
  local_38 = a.low;
  local_30 = uVar1 & 0xffffffffffff;
  local_3c = a.high._6_2_ & 0x7fff;
  uVar4 = a.high._4_4_ >> 0x1f;
  if (((undefined1  [16])a & (undefined1  [16])0x7fff000000000000) == (undefined1  [16])0x0) {
    if (((undefined1  [16])a & (undefined1  [16])0xffffffffffff) != (undefined1  [16])0x0 ||
        local_38 != 0) {
      normalizeFloat128Subnormal(local_30,local_38,(int32_t *)&local_3c,&local_30,&local_38);
      uVar1 = local_30;
      goto LAB_004e3c7b;
    }
    uVar4 = uVar4 << 0xf;
    uVar1 = 0;
  }
  else {
    if (local_3c != 0x7fff) {
      uVar1 = local_30 + 0x1000000000000;
LAB_004e3c7b:
      fVar6 = roundAndPackFloatx80_x86_64
                        ('P',a.high._7_1_ >> 7,local_3c,uVar1 << 0xf | local_38 >> 0x31,
                         local_38 << 0xf,status);
      return fVar6;
    }
    if (((undefined1  [16])a & (undefined1  [16])0xffffffffffff) != (undefined1  [16])0x0 ||
        local_38 != 0) {
      if (((uVar1 & 0x7fff800000000000) == 0x7fff000000000000) &&
         (((undefined1  [16])a & (undefined1  [16])0x7fffffffffff) != (undefined1  [16])0x0 ||
          local_38 != 0)) {
        status->float_exception_flags = status->float_exception_flags | 1;
      }
      uVar3 = uVar1 << 0x10 | local_38 >> 0x30;
      bVar5 = status->default_nan_mode == '\0';
      uVar1 = 0xc000000000000000;
      if (1 < uVar3 && bVar5) {
        uVar1 = uVar3 >> 1 | 0x8000000000000000;
      }
      uVar2 = 0xffff;
      if (1 < uVar3 && bVar5) {
        uVar2 = (ulong)(uVar4 << 0xf | 0x7fff);
      }
      goto LAB_004e3cc2;
    }
    uVar4 = uVar4 << 0xf | 0x7fff;
    uVar1 = 0x8000000000000000;
  }
  uVar2 = (ulong)uVar4;
LAB_004e3cc2:
  fVar6._8_8_ = uVar2;
  fVar6.low = uVar1;
  return fVar6;
}

Assistant:

floatx80 float128_to_floatx80(float128 a, float_status *status)
{
    flag aSign;
    int32_t aExp;
    uint64_t aSig0, aSig1;

    aSig1 = extractFloat128Frac1( a );
    aSig0 = extractFloat128Frac0( a );
    aExp = extractFloat128Exp( a );
    aSign = extractFloat128Sign( a );
    if ( aExp == 0x7FFF ) {
        if ( aSig0 | aSig1 ) {
            return commonNaNToFloatx80(float128ToCommonNaN(a, status), status);
        }
        return packFloatx80(aSign, floatx80_infinity_high,
                                   floatx80_infinity_low);
    }
    if ( aExp == 0 ) {
        if ( ( aSig0 | aSig1 ) == 0 ) return packFloatx80( aSign, 0, 0 );
        normalizeFloat128Subnormal( aSig0, aSig1, &aExp, &aSig0, &aSig1 );
    }
    else {
        aSig0 |= UINT64_C(0x0001000000000000);
    }
    shortShift128Left( aSig0, aSig1, 15, &aSig0, &aSig1 );
    return roundAndPackFloatx80(80, aSign, aExp, aSig0, aSig1, status);

}